

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion.cpp
# Opt level: O2

void __thiscall
booster::locale::impl_icu::utf8_converter_impl::~utf8_converter_impl(utf8_converter_impl *this)

{
  *(undefined ***)&this->super_converter<char> = &PTR__utf8_converter_impl_001dadc8;
  raii_casemap::~raii_casemap(&this->map_);
  std::__cxx11::string::~string((string *)&this->locale_id_);
  std::locale::facet::~facet((facet *)this);
  return;
}

Assistant:

utf8_converter_impl(cdata const &d) :
            locale_id_(d.locale.getName()),
            map_(locale_id_)
        {
        }